

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O1

void __thiscall
Descriptor_Parse_sh_miniscript_Test::~Descriptor_Parse_sh_miniscript_Test
          (Descriptor_Parse_sh_miniscript_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Descriptor, Parse_sh_miniscript) {
  // cfd::core::CfdCoreHandle handle = nullptr;
  // cfd::core::Initialize(&handle);
  std::string descriptor = "sh(or_d(sha256(38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6),and_n(un:after(499999999),older(4194305))))";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  Script gen_script;
  std::vector<DescriptorScriptReference> script_list;

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  std::vector<std::string> arg_list1;
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll(nullptr));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "OP_HASH160 4abf8cfc94ae837bf59965e0c74d02a611ec1329 OP_EQUAL");

  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_TRUE(script_list[0].HasAddress());
    EXPECT_STREQ(script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "38WFPv9fne2UeFxVkGMhLkamMadH8j6s1c");
    EXPECT_EQ(script_list[0].GetAddressType(), AddressType::kP2shAddress);
    EXPECT_EQ(script_list[0].GetHashType(), HashType::kP2sh);
    EXPECT_EQ(script_list[0].GetScriptType(), DescriptorScriptType::kDescriptorScriptSh);

    EXPECT_TRUE(script_list[0].HasChild());
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      "OP_SIZE 32 OP_EQUALVERIFY OP_SHA256 38df1c1f64a24a77b23393bca50dff872e31edc4f3b5aa3b90ad0b82f4f089b6 OP_EQUAL OP_IFDUP OP_NOTIF OP_IF 499999999 OP_CHECKLOCKTIMEVERIFY OP_0NOTEQUAL OP_ELSE 0 OP_ENDIF OP_NOTIF 0 OP_ELSE 4194305 OP_CHECKSEQUENCEVERIFY OP_ENDIF OP_ENDIF");
    EXPECT_FALSE(script_list[0].GetChild().HasChild());
    EXPECT_FALSE(script_list[0].GetChild().HasKey());
    EXPECT_FALSE(script_list[0].GetChild().HasRedeemScript());
    EXPECT_EQ(script_list[0].GetChild().GetScriptType(), DescriptorScriptType::kDescriptorScriptMiniscript);
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      script_list[0].GetChild().GetLockingScript().ToString().c_str());
  }
}